

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

void helics::detail::convertFromBinary(byte *data,vector<double,_std::allocator<double>_> *val)

{
  undefined1 uVar1;
  undefined4 uVar2;
  pointer pdVar3;
  pointer pdVar4;
  undefined1 *puVar5;
  vector<double,_std::allocator<double>_> *__range3;
  undefined1 *puVar6;
  long lVar7;
  uint uVar8;
  
  uVar2 = *(undefined4 *)(data + 4);
  uVar8 = (uint)uVar2 >> 0x18 | (uint)(uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
          uVar2 << 0x18;
  std::vector<double,_std::allocator<double>_>::resize(val,(ulong)uVar8);
  if (uVar8 != 0) {
    memcpy((val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start,data + 8,(ulong)uVar8 * 8);
  }
  if ((*data & 1) != 0) {
    pdVar4 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar4 != pdVar3) {
      puVar5 = (undefined1 *)((long)pdVar4 + 7);
      do {
        lVar7 = 0;
        puVar6 = puVar5;
        do {
          uVar1 = *(undefined1 *)((long)pdVar4 + lVar7);
          *(undefined1 *)((long)pdVar4 + lVar7) = *puVar6;
          *puVar6 = uVar1;
          lVar7 = lVar7 + 1;
          puVar6 = puVar6 + -1;
        } while (lVar7 != 4);
        pdVar4 = pdVar4 + 1;
        puVar5 = puVar5 + 8;
      } while (pdVar4 != pdVar3);
    }
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::vector<double>& val)
{
    const std::size_t size = getDataSize(data);
    val.resize(size);
    if (size > 0) {
        std::memcpy(val.data(), data + 8, size * sizeof(double));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        for (auto& element : val) {
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&element));
        }
    }
}